

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::write_escaped_char<char,fmt::v10::appender>(appender out,char v)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  uint32_t cp;
  char v_array [1];
  char local_31;
  find_escape_result<char> local_30;
  
  lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10);
  uVar4 = lVar2 + 1;
  local_31 = v;
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x18) < uVar4) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar4 = lVar2 + 1;
  }
  *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
       = uVar4;
  *(undefined1 *)
   (*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 8) +
   lVar2) = 0x27;
  cp = (uint32_t)v;
  bVar1 = true;
  if ((((0x1f < (byte)v) && (cp != 0x22)) && (cp != 0x5c)) && (cp != 0x7f)) {
    bVar1 = is_printable(cp);
    bVar1 = !bVar1;
  }
  if ((v == '\'') || ((bool)(v != '\"' & bVar1))) {
    local_30.begin = &local_31;
    local_30.end = (char *)&local_30;
    local_30.cp = cp;
    out = write_escaped_cp<fmt::v10::appender,char>(out,&local_30);
  }
  else {
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar4 = lVar2 + 1;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) < uVar4) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      uVar4 = lVar2 + 1;
    }
    *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
              0x10) = uVar4;
    *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 8) + lVar2) = v;
  }
  sVar3 = ((buffer<char> *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
          )->size_;
  uVar4 = sVar3 + 1;
  if (((buffer<char> *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->
      capacity_ < uVar4) {
    (**((buffer<char> *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->
       _vptr_buffer)(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    sVar3 = ((buffer<char> *)
            out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->size_;
    uVar4 = sVar3 + 1;
  }
  ((buffer<char> *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->size_
       = uVar4;
  ((buffer<char> *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->ptr_
  [sVar3] = '\'';
  return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

auto write_escaped_char(OutputIt out, Char v) -> OutputIt {
  Char v_array[1] = {v};
  *out++ = static_cast<Char>('\'');
  if ((needs_escape(static_cast<uint32_t>(v)) && v != static_cast<Char>('"')) ||
      v == static_cast<Char>('\'')) {
    out = write_escaped_cp(out,
                           find_escape_result<Char>{v_array, v_array + 1,
                                                    static_cast<uint32_t>(v)});
  } else {
    *out++ = v;
  }
  *out++ = static_cast<Char>('\'');
  return out;
}